

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void api_suite::api_signed_output(void)

{
  char input [3];
  int result;
  decoder_type decoder;
  value_type local_16c [4];
  value local_168 [2];
  basic_decoder<char> local_160;
  
  local_160.input.tail = local_16c + 2;
  local_16c[2] = 0;
  local_16c[0] = '4';
  local_16c[1] = '2';
  local_160.input.head = local_16c;
  memset(&local_160.current,0,0x120);
  local_160.current.code = uninitialized;
  local_160.current.view.head = (const_pointer)0x0;
  local_160.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_160);
  local_168[0] = local_160.current.code;
  local_168[1] = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x4d,"void api_suite::api_signed_output()",local_168,local_168 + 1);
  local_168[0] = end;
  trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&local_160,local_168);
  local_168[1] = 0x2a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result","42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x50,"void api_suite::api_signed_output()",local_168,local_168 + 1);
  return;
}

Assistant:

void api_signed_output()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    int result = {};
    TRIAL_PROTOCOL_TEST_NO_THROW(decoder.signed_value(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, 42);
}